

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
defyx::AssemblyGeneratorX86::h_IMUL_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  size_t sVar4;
  long *this_00;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  bVar2 = instr->src;
  this_00 = (long *)&this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\timul ",6);
  pcVar3 = *(char **)(regR + (ulong)instr->dst * 8);
  sVar4 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  if (bVar2 == bVar1) {
    this_00 = (long *)std::ostream::operator<<(this_00,instr->imm32);
  }
  else {
    pcVar3 = *(char **)(regR + (ulong)instr->src * 8);
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(*this_00 + -0x18) + (char)this_00);
  std::ostream::put((char)this_00);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IMUL_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			asmCode << "\timul " << regR[instr.dst] << ", " << regR[instr.src] << std::endl;
		}
		else {
			asmCode << "\timul " << regR[instr.dst] << ", " << (int32_t)instr.getImm32() << std::endl;
		}
		traceint(instr);
	}